

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall jsonnet::internal::Unparser::unparse(Unparser *this,AST *ast_,bool space_before)

{
  char32_t cVar1;
  int iVar2;
  int *piVar3;
  AST *pAVar4;
  long lVar5;
  ostream *poVar6;
  BinaryOp bop;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  Field *field;
  undefined8 *puVar10;
  int *piVar11;
  char *pcVar12;
  char32_t *pcVar13;
  undefined8 *puVar14;
  long lVar15;
  pointer *ppFVar16;
  Element *element;
  Fodder *pFVar17;
  bool bVar18;
  undefined1 auVar19 [12];
  string local_58;
  long local_38;
  
  pAVar4 = left_recursive(ast_);
  fodder_fill(this->o,&ast_->openFodder,space_before,pAVar4 == (AST *)0x0,false);
  if (ast_ != (AST *)0x0) {
    do {
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo);
      if (lVar5 != 0) {
        unparse(this,*(AST **)(lVar5 + 0x80),(bool)(space_before & 1));
        fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"(",1);
        lVar7 = *(long *)(lVar5 + 0xa8);
        if (*(long *)(lVar5 + 0xa0) != lVar7) {
          bVar9 = true;
          ppFVar16 = (pointer *)(*(long *)(lVar5 + 0xa0) + 0x40);
          do {
            if (!bVar9) {
              local_58._M_dataplus._M_p._0_1_ = 0x2c;
              std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
            }
            bVar9 = (bool)(bVar9 ^ 1);
            if (ppFVar16[-5] != (pointer)0x0) {
              fodder_fill(this->o,(Fodder *)(ppFVar16 + -8),bVar9,true,false);
              poVar6 = this->o;
              unparse_id_abi_cxx11_
                        (&local_58,*(internal **)ppFVar16[-5],*(Identifier **)&ppFVar16[-5]->indent)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->o,"=",1);
              bVar9 = false;
            }
            unparse(this,(AST *)ppFVar16[-1],bVar9);
            bVar9 = false;
            fodder_fill(this->o,(Fodder *)ppFVar16,false,false,false);
            lVar15 = (long)(ppFVar16 + 3);
            ppFVar16 = ppFVar16 + 0xb;
          } while (lVar15 != lVar7);
        }
        if (*(char *)(lVar5 + 0xb8) != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
        }
        fodder_fill(this->o,(Fodder *)(lVar5 + 0xc0),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
        if (*(char *)(lVar5 + 0xf0) != '\x01') {
          return;
        }
        fodder_fill(this->o,(Fodder *)(lVar5 + 0xd8),true,true,false);
        poVar6 = this->o;
        pcVar12 = "tailstrict";
        lVar5 = 10;
        goto LAB_001f0ec2;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo);
      if (lVar5 == 0) {
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Array::typeinfo);
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
          puVar14 = *(undefined8 **)(lVar5 + 0x80);
          puVar10 = *(undefined8 **)(lVar5 + 0x88);
          if (puVar14 != puVar10) {
            bVar9 = true;
            do {
              if (!bVar9) {
                local_58._M_dataplus._M_p._0_1_ = 0x2c;
                std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
              }
              unparse(this,(AST *)*puVar14,(bool)((~bVar9 | (this->opts).padArrays) & 1));
              bVar9 = false;
              fodder_fill(this->o,(Fodder *)(puVar14 + 1),false,false,false);
              puVar14 = puVar14 + 4;
            } while (puVar14 != puVar10);
          }
          if (*(char *)(lVar5 + 0x98) != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
          }
          fodder_fill(this->o,(Fodder *)(lVar5 + 0xa0),
                      *(long *)(lVar5 + 0x88) != *(long *)(lVar5 + 0x80),(this->opts).padArrays,
                      false);
          poVar6 = this->o;
          pcVar12 = "]";
          goto LAB_001f0ebd;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ArrayComprehension::typeinfo);
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
          unparse(this,*(AST **)(lVar5 + 0x80),(this->opts).padArrays);
          fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),false,false,false);
          if (*(char *)(lVar5 + 0xa0) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
          }
          unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                             *)(lVar5 + 0xa8));
          pFVar17 = (Fodder *)(lVar5 + 0xc0);
          bVar9 = (this->opts).padArrays;
          poVar6 = this->o;
          bVar18 = true;
LAB_001f0f59:
          fodder_fill(poVar6,pFVar17,bVar18,bVar9,false);
          poVar6 = this->o;
          pcVar12 = "]";
          goto LAB_001f0f6b;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Assert::typeinfo);
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"assert",6);
          unparse(this,*(AST **)(lVar5 + 0x80),true);
          if (*(long *)(lVar5 + 0xa0) != 0) {
            fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),true,true,false);
            std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
            unparse(this,*(AST **)(lVar5 + 0xa0),true);
          }
          fodder_fill(this->o,(Fodder *)(lVar5 + 0xa8),false,false,false);
          std::__ostream_insert<char,std::char_traits<char>>(this->o,";",1);
          puVar14 = (undefined8 *)(lVar5 + 0xc0);
          goto LAB_001f0982;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo);
        if (lVar5 != 0) {
          unparse(this,*(AST **)(lVar5 + 0x80),(bool)(space_before & 1));
          fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),true,true,false);
          poVar6 = this->o;
          bop_string_abi_cxx11_(&local_58,(internal *)(ulong)*(uint *)(lVar5 + 0xa0),bop);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          pAVar4 = *(AST **)(lVar5 + 0xa8);
          goto LAB_001f0ff3;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&BuiltinFunction::typeinfo);
        if (lVar5 != 0) {
          poVar6 = this->o;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/* builtin ",0xb);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)(lVar5 + 0x80),*(long *)(lVar5 + 0x88));
          pcVar12 = " */ null";
          uVar8 = 8;
          goto LAB_001f1044;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Conditional::typeinfo);
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"if",2);
          unparse(this,*(AST **)(lVar5 + 0x80),true);
          fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),true,true,false);
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"then",4);
          if (*(long *)(lVar5 + 0xc0) == 0) {
            puVar14 = (undefined8 *)(lVar5 + 0xa0);
          }
          else {
            puVar14 = (undefined8 *)(lVar5 + 0xc0);
            unparse(this,*(AST **)(lVar5 + 0xa0),true);
            fodder_fill(this->o,(Fodder *)(lVar5 + 0xa8),true,true,false);
            std::__ostream_insert<char,std::char_traits<char>>(this->o,"else",4);
          }
          goto LAB_001f0982;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Dollar::typeinfo);
        if (lVar5 != 0) {
          poVar6 = this->o;
          pcVar12 = "$";
          goto LAB_001f0f6b;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Error::typeinfo);
        if (lVar5 != 0) {
          poVar6 = this->o;
          lVar7 = 5;
          pcVar12 = "error";
          goto LAB_001f0b19;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Function::typeinfo);
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"function",8);
          unparseParams(this,(Fodder *)(lVar5 + 0x80),(ArgParams *)(lVar5 + 0x98),
                        *(bool *)(lVar5 + 0xb0),(Fodder *)(lVar5 + 0xb8));
          puVar14 = (undefined8 *)(lVar5 + 0xd0);
          goto LAB_001f0982;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Import::typeinfo);
        if (lVar5 == 0) {
          lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Importstr::typeinfo);
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Importbin::typeinfo);
            if (lVar5 == 0) {
              lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo);
              if (lVar5 != 0) {
                unparse(this,*(AST **)(lVar5 + 0x80),true);
                fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),true,true,false);
                std::__ostream_insert<char,std::char_traits<char>>(this->o,"in",2);
                fodder_fill(this->o,(Fodder *)(lVar5 + 0xa0),true,true,false);
                poVar6 = this->o;
                pcVar12 = "super";
                uVar8 = 5;
                goto LAB_001f1044;
              }
              lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo);
              if (lVar5 != 0) {
                unparse(this,*(AST **)(lVar5 + 0x80),(bool)(space_before & 1));
                fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),false,false,false);
                if (*(long *)(lVar5 + 0x108) != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,".",1);
                  fodder_fill(this->o,(Fodder *)(lVar5 + 0xf0),false,false,false);
                  poVar6 = this->o;
                  unparse_id_abi_cxx11_
                            (&local_58,(internal *)**(undefined8 **)(lVar5 + 0x108),
                             (Identifier *)(*(undefined8 **)(lVar5 + 0x108))[1]);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                  goto LAB_001f11b3;
                }
                std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
                pAVar4 = *(AST **)(lVar5 + 0xa8);
                if (*(char *)(lVar5 + 0xa0) == '\x01') {
                  if (pAVar4 != (AST *)0x0) {
                    unparse(this,pAVar4,false);
                  }
                  fodder_fill(this->o,(Fodder *)(lVar5 + 0xb0),false,false,false);
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
                  if (*(AST **)(lVar5 + 200) != (AST *)0x0) {
                    unparse(this,*(AST **)(lVar5 + 200),false);
                  }
                  if ((*(long *)(lVar5 + 0xe8) != 0) ||
                     (*(long *)(lVar5 + 0xd8) != *(long *)(lVar5 + 0xd0))) {
                    fodder_fill(this->o,(Fodder *)(lVar5 + 0xd0),false,false,false);
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
                    pAVar4 = *(AST **)(lVar5 + 0xe8);
                    if (pAVar4 != (AST *)0x0) goto LAB_001f1420;
                  }
                }
                else {
LAB_001f1420:
                  unparse(this,pAVar4,false);
                }
                pFVar17 = (Fodder *)(lVar5 + 0xf0);
LAB_001f1431:
                poVar6 = this->o;
                bVar18 = false;
                bVar9 = false;
                goto LAB_001f0f59;
              }
              local_38 = __dynamic_cast(ast_,&AST::typeinfo,&Local::typeinfo);
              if (local_38 == 0) {
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralBoolean::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar12 = "false";
                  if ((ulong)*(byte *)(lVar5 + 0x80) != 0) {
                    pcVar12 = "true";
                  }
                  uVar8 = (ulong)*(byte *)(lVar5 + 0x80) ^ 5;
                  goto LAB_001f1044;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNumber::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar12 = *(char **)(lVar5 + 0x88);
                  uVar8 = *(ulong *)(lVar5 + 0x90);
                  goto LAB_001f1044;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralString::typeinfo);
                if (lVar5 != 0) {
                  switch(*(undefined4 *)(lVar5 + 0xa0)) {
                  case 0:
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\'",1);
                    poVar6 = this->o;
                    encode_utf8(&local_58,*(internal **)(lVar5 + 0x80),*(UString **)(lVar5 + 0x88));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_58._M_dataplus._M_p != &local_58.field_2) {
                      operator_delete(local_58._M_dataplus._M_p,
                                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                               local_58.field_2._M_local_buf[0]) + 1);
                    }
                    goto LAB_001f1584;
                  case 1:
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\"",1);
                    poVar6 = this->o;
                    encode_utf8(&local_58,*(internal **)(lVar5 + 0x80),*(UString **)(lVar5 + 0x88));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_58._M_dataplus._M_p != &local_58.field_2) {
                      operator_delete(local_58._M_dataplus._M_p,
                                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                               local_58.field_2._M_local_buf[0]) + 1);
                    }
                    goto LAB_001f16c2;
                  case 2:
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"|||",3);
                    if (*(int *)(*(long *)(lVar5 + 0x80) + -4 + *(long *)(lVar5 + 0x88) * 4) != 10)
                    {
                      std::__ostream_insert<char,std::char_traits<char>>(this->o,"-",1);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
                    pcVar13 = *(char32_t **)(lVar5 + 0x80);
                    if (*pcVar13 != L'\n') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                (this->o,*(char **)(lVar5 + 0xa8),*(long *)(lVar5 + 0xb0));
                      pcVar13 = *(char32_t **)(lVar5 + 0x80);
                    }
                    break;
                  case 3:
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"@\'",2);
                    pcVar13 = *(char32_t **)(lVar5 + 0x80);
                    goto LAB_001f1805;
                  case 4:
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"@\"",2);
                    pcVar13 = *(char32_t **)(lVar5 + 0x80);
                    goto LAB_001f1899;
                  case 5:
                    __assert_fail("ast->tokenKind != LiteralString::RAW_DESUGARED",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                  ,0x1ed,
                                  "void jsonnet::internal::Unparser::unparse(const AST *, bool)");
                  default:
                    goto switchD_001f1528_default;
                  }
                  goto LAB_001f1755;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNull::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar12 = "null";
LAB_001f15ba:
                  uVar8 = 4;
                  goto LAB_001f1044;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Object::typeinfo);
                if (lVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
                  unparseFields(this,(ObjectFields *)(lVar5 + 0x80),(this->opts).padObjects);
                  if (*(char *)(lVar5 + 0x98) == '\x01') {
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
                  }
                  pFVar17 = (Fodder *)(lVar5 + 0xa0);
                  bVar18 = *(long *)(lVar5 + 0x88) != *(long *)(lVar5 + 0x80);
                  bVar9 = (this->opts).padObjects;
                  poVar6 = this->o;
LAB_001f1651:
                  fodder_fill(poVar6,pFVar17,bVar18,bVar9,false);
                  goto LAB_001f1659;
                }
                local_38 = __dynamic_cast(ast_,&AST::typeinfo,&DesugaredObject::typeinfo);
                if (local_38 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
                  puVar10 = (undefined8 *)(local_38 + 0x80);
                  for (puVar14 = *(undefined8 **)(local_38 + 0x80); puVar14 != puVar10;
                      puVar14 = (undefined8 *)*puVar14) {
                    pAVar4 = (AST *)puVar14[2];
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"assert",6);
                    unparse(this,pAVar4,true);
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
                  }
                  piVar3 = *(int **)(local_38 + 0xa0);
                  for (piVar11 = *(int **)(local_38 + 0x98); piVar11 != piVar3;
                      piVar11 = piVar11 + 6) {
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
                    unparse(this,*(AST **)(piVar11 + 2),false);
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,"]",1);
                    iVar2 = *piVar11;
                    if (iVar2 == 0) {
                      poVar6 = this->o;
                      lVar5 = 2;
                      pcVar12 = "::";
LAB_001f1a93:
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,lVar5);
                    }
                    else {
                      if (iVar2 == 2) {
                        poVar6 = this->o;
                        lVar5 = 3;
                        pcVar12 = ":::";
                        goto LAB_001f1a93;
                      }
                      if (iVar2 == 1) {
                        poVar6 = this->o;
                        lVar5 = 1;
                        pcVar12 = ":";
                        goto LAB_001f1a93;
                      }
                    }
                    unparse(this,*(AST **)(piVar11 + 4),true);
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
                  }
LAB_001f1659:
                  poVar6 = this->o;
                  pcVar12 = "}";
LAB_001f0f6b:
                  uVar8 = 1;
LAB_001f1044:
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,uVar8);
                  return;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehension::typeinfo);
                if (lVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
                  unparseFields(this,(ObjectFields *)(lVar5 + 0x80),(this->opts).padObjects);
                  if (*(char *)(lVar5 + 0x98) == '\x01') {
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
                  }
                  unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                                     *)(lVar5 + 0xa0));
                  pFVar17 = (Fodder *)(lVar5 + 0xb8);
                  bVar9 = (this->opts).padObjects;
                  poVar6 = this->o;
                  bVar18 = true;
                  goto LAB_001f1651;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo);
                if (lVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"{[",2);
                  unparse(this,*(AST **)(lVar5 + 0x80),false);
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"]:",2);
                  unparse(this,*(AST **)(lVar5 + 0x88),true);
                  poVar6 = this->o;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," for ",5);
                  unparse_id_abi_cxx11_
                            (&local_58,(internal *)**(undefined8 **)(lVar5 + 0x90),
                             (Identifier *)(*(undefined8 **)(lVar5 + 0x90))[1]);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6," in",3);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                  }
                  unparse(this,*(AST **)(lVar5 + 0x98),true);
                  poVar6 = this->o;
                  pcVar12 = "}";
                  goto LAB_001f0ebd;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Parens::typeinfo);
                if (lVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"(",1);
                  unparse(this,*(AST **)(lVar5 + 0x80),false);
                  fodder_fill(this->o,(Fodder *)(lVar5 + 0x88),false,false,false);
                  poVar6 = this->o;
                  pcVar12 = ")";
                  goto LAB_001f0f6b;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Self::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar12 = "self";
                  goto LAB_001f15ba;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&SuperIndex::typeinfo);
                if (lVar5 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"super",5);
                  fodder_fill(this->o,(Fodder *)(lVar5 + 0x80),false,false,false);
                  if (*(long *)(lVar5 + 0xb8) != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,".",1);
                    fodder_fill(this->o,(Fodder *)(lVar5 + 0xa0),false,false,false);
                    poVar6 = this->o;
                    unparse_id_abi_cxx11_
                              (&local_58,(internal *)**(undefined8 **)(lVar5 + 0xb8),
                               (Identifier *)(*(undefined8 **)(lVar5 + 0xb8))[1]);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                    goto LAB_001f11b3;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
                  unparse(this,*(AST **)(lVar5 + 0x98),false);
                  pFVar17 = (Fodder *)(lVar5 + 0xa0);
                  goto LAB_001f1431;
                }
                auVar19 = __dynamic_cast(ast_,&AST::typeinfo,&Unary::typeinfo,0);
                lVar5 = auVar19._0_8_;
                if (lVar5 == 0) {
                  lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Var::typeinfo,0);
                  if (lVar5 != 0) {
                    poVar6 = this->o;
                    encode_utf8(&local_58,(internal *)**(undefined8 **)(lVar5 + 0x80),
                                (UString *)(*(undefined8 **)(lVar5 + 0x80))[1]);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_001f11b3:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_58._M_dataplus._M_p == &local_58.field_2) {
                      return;
                    }
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                    return;
                  }
                  goto LAB_001f1488;
                }
                poVar6 = this->o;
                uop_string_abi_cxx11_
                          (&local_58,(internal *)(ulong)*(uint *)(lVar5 + 0x80),auVar19._8_4_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                           local_58.field_2._M_local_buf[0]) + 1);
                }
                pAVar4 = *(AST **)(lVar5 + 0x88);
                bVar9 = false;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(this->o,"local",5);
                lVar5 = *(long *)(local_38 + 0x88);
                if (lVar5 == *(long *)(local_38 + 0x80)) {
                  __assert_fail("ast->binds.size() > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                ,0x1d0,
                                "void jsonnet::internal::Unparser::unparse(const AST *, bool)");
                }
                bVar9 = true;
                ppFVar16 = (pointer *)(*(long *)(local_38 + 0x80) + 0x80);
                do {
                  if (!bVar9) {
                    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
                  }
                  fodder_fill(this->o,(Fodder *)(ppFVar16 + -0x10),true,true,false);
                  poVar6 = this->o;
                  unparse_id_abi_cxx11_
                            (&local_58,*(internal **)ppFVar16[-0xd],
                             *(Identifier **)&ppFVar16[-0xd]->indent);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,local_58._M_dataplus._M_p,local_58._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                  }
                  if (*(char *)(ppFVar16 + -8) == '\x01') {
                    unparseParams(this,(Fodder *)(ppFVar16 + -7),(ArgParams *)(ppFVar16 + -4),
                                  *(bool *)(ppFVar16 + -1),(Fodder *)ppFVar16);
                  }
                  bVar9 = false;
                  fodder_fill(this->o,(Fodder *)(ppFVar16 + -0xc),true,true,false);
                  std::__ostream_insert<char,std::char_traits<char>>(this->o,"=",1);
                  unparse(this,(AST *)(((Fodder *)(ppFVar16 + -9))->
                                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      )._M_impl.super__Vector_impl_data._M_start,true);
                  fodder_fill(this->o,(Fodder *)(ppFVar16 + 3),false,false,false);
                  lVar7 = (long)(ppFVar16 + 6);
                  ppFVar16 = ppFVar16 + 0x16;
                } while (lVar7 != lVar5);
                std::__ostream_insert<char,std::char_traits<char>>(this->o,";",1);
                pAVar4 = *(AST **)(local_38 + 0x98);
LAB_001f0ff3:
                bVar9 = true;
              }
              unparse(this,pAVar4,bVar9);
              return;
            }
            poVar6 = this->o;
            lVar7 = 9;
            pcVar12 = "importbin";
          }
          else {
            poVar6 = this->o;
            lVar7 = 9;
            pcVar12 = "importstr";
          }
        }
        else {
          poVar6 = this->o;
          lVar7 = 6;
          pcVar12 = "import";
        }
LAB_001f0b19:
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,lVar7);
        puVar14 = (undefined8 *)(lVar5 + 0x80);
        goto LAB_001f0982;
      }
      unparse(this,*(AST **)(lVar5 + 0x80),(bool)(space_before & 1));
      puVar14 = (undefined8 *)(lVar5 + 0x88);
LAB_001f0982:
      ast_ = (AST *)*puVar14;
      pAVar4 = left_recursive(ast_);
      fodder_fill(this->o,&ast_->openFodder,true,pAVar4 == (AST *)0x0,false);
      space_before = true;
    } while (ast_ != (AST *)0x0);
  }
  ast_ = (AST *)0x0;
LAB_001f1488:
  poVar6 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,ast_);
  std::endl<char,std::char_traits<char>>(poVar6);
  abort();
LAB_001f1899:
  cVar1 = *pcVar13;
  if (cVar1 == L'\"') {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\"\"",2);
  }
  else {
    if (cVar1 == L'\0') goto LAB_001f16c2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    encode_utf8(cVar1,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar13 = pcVar13 + 1;
  goto LAB_001f1899;
LAB_001f1805:
  cVar1 = *pcVar13;
  if (cVar1 == L'\'') {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\'\'",2);
  }
  else {
    if (cVar1 == L'\0') goto LAB_001f1584;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    encode_utf8(cVar1,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar13 = pcVar13 + 1;
  goto LAB_001f1805;
LAB_001f1755:
  cVar1 = *pcVar13;
  if (cVar1 != L'\r') {
    if (cVar1 == L'\0') goto LAB_001f1903;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    encode_utf8(cVar1,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
    if (((*pcVar13 == L'\n') && (pcVar13[1] != L'\0')) && (pcVar13[1] != L'\n')) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->o,*(char **)(lVar5 + 0xa8),*(long *)(lVar5 + 0xb0));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar13 = pcVar13 + 1;
  goto LAB_001f1755;
LAB_001f1903:
  if (*(int *)(*(long *)(lVar5 + 0x80) + -4 + *(long *)(lVar5 + 0x88) * 4) != 10) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->o,*(char **)(lVar5 + 200),*(long *)(lVar5 + 0xd0));
  pcVar12 = "|||";
  lVar5 = 3;
  goto LAB_001f0ec2;
LAB_001f16c2:
  poVar6 = this->o;
  pcVar12 = "\"";
  goto LAB_001f0ebd;
LAB_001f1584:
  poVar6 = this->o;
  pcVar12 = "\'";
LAB_001f0ebd:
  lVar5 = 1;
LAB_001f0ec2:
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,lVar5);
switchD_001f1528_default:
  return;
}

Assistant:

void unparse(const AST *ast_, bool space_before)
    {
        bool separate_token = !left_recursive(ast_);

        fill(ast_->openFodder, space_before, separate_token);

        if (auto *ast = dynamic_cast<const Apply *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->fodderL, false, false);
            o << "(";
            bool first = true;
            for (const auto &arg : ast->args) {
                if (!first)
                    o << ',';
                bool space = !first;
                if (arg.id != nullptr) {
                    fill(arg.idFodder, space, true);
                    o << unparse_id(arg.id);
                    space = false;
                    o << "=";
                }
                unparse(arg.expr, space);
                fill(arg.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->fodderR, false, false);
            o << ")";
            if (ast->tailstrict) {
                fill(ast->tailstrictFodder, true, true);
                o << "tailstrict";
            }

        } else if (auto *ast = dynamic_cast<const ApplyBrace *>(ast_)) {
            unparse(ast->left, space_before);
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const Array *>(ast_)) {
            o << "[";
            bool first = true;
            for (const auto &element : ast->elements) {
                if (!first)
                    o << ',';
                unparse(element.expr, !first || opts.padArrays);
                fill(element.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->elements.size() > 0, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const ArrayComprehension *>(ast_)) {
            o << "[";
            unparse(ast->body, opts.padArrays);
            fill(ast->commaFodder, false, false);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const Assert *>(ast_)) {
            o << "assert";
            unparse(ast->cond, true);
            if (ast->message != nullptr) {
                fill(ast->colonFodder, true, true);
                o << ":";
                unparse(ast->message, true);
            }
            fill(ast->semicolonFodder, false, false);
            o << ";";
            unparse(ast->rest, true);

        } else if (auto *ast = dynamic_cast<const Binary *>(ast_)) {
            unparse(ast->left, space_before);
            fill(ast->opFodder, true, true);
            o << bop_string(ast->op);
            // The - 1 is for left associativity.
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const BuiltinFunction *>(ast_)) {
            o << "/* builtin " << ast->name << " */ null";

        } else if (auto *ast = dynamic_cast<const Conditional *>(ast_)) {
            o << "if";
            unparse(ast->cond, true);
            fill(ast->thenFodder, true, true);
            o << "then";
            if (ast->branchFalse != nullptr) {
                unparse(ast->branchTrue, true);
                fill(ast->elseFodder, true, true);
                o << "else";
                unparse(ast->branchFalse, true);
            } else {
                unparse(ast->branchTrue, true);
            }

        } else if (dynamic_cast<const Dollar *>(ast_)) {
            o << "$";

        } else if (auto *ast = dynamic_cast<const Error *>(ast_)) {
            o << "error";
            unparse(ast->expr, true);

        } else if (auto *ast = dynamic_cast<const Function *>(ast_)) {
            o << "function";
            unparseParams(
                ast->parenLeftFodder, ast->params, ast->trailingComma, ast->parenRightFodder);
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const Import *>(ast_)) {
            o << "import";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importstr *>(ast_)) {
            o << "importstr";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importbin *>(ast_)) {
            o << "importbin";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const InSuper *>(ast_)) {
            unparse(ast->element, true);
            fill(ast->inFodder, true, true);
            o << "in";
            fill(ast->superFodder, true, true);
            o << "super";

        } else if (auto *ast = dynamic_cast<const Index *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                if (ast->isSlice) {
                    if (ast->index != nullptr) {
                        unparse(ast->index, false);
                    }
                    fill(ast->endColonFodder, false, false);
                    o << ":";
                    if (ast->end != nullptr) {
                        unparse(ast->end, false);
                    }
                    if (ast->step != nullptr || ast->stepColonFodder.size() > 0) {
                        fill(ast->stepColonFodder, false, false);
                        o << ":";
                        if (ast->step != nullptr) {
                            unparse(ast->step, false);
                        }
                    }
                } else {
                    unparse(ast->index, false);
                }
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Local *>(ast_)) {
            o << "local";
            assert(ast->binds.size() > 0);
            bool first = true;
            for (const auto &bind : ast->binds) {
                if (!first)
                    o << ",";
                first = false;
                fill(bind.varFodder, true, true);
                o << unparse_id(bind.var);
                if (bind.functionSugar) {
                    unparseParams(bind.parenLeftFodder,
                                  bind.params,
                                  bind.trailingComma,
                                  bind.parenRightFodder);
                }
                fill(bind.opFodder, true, true);
                o << "=";
                unparse(bind.body, true);
                fill(bind.closeFodder, false, false);
            }
            o << ";";
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const LiteralBoolean *>(ast_)) {
            o << (ast->value ? "true" : "false");

        } else if (auto *ast = dynamic_cast<const LiteralNumber *>(ast_)) {
            o << ast->originalString;

        } else if (auto *ast = dynamic_cast<const LiteralString *>(ast_)) {
            assert(ast->tokenKind != LiteralString::RAW_DESUGARED);
            if (ast->tokenKind == LiteralString::DOUBLE) {
                o << "\"";
                o << encode_utf8(ast->value);
                o << "\"";
            } else if (ast->tokenKind == LiteralString::SINGLE) {
                o << "'";
                o << encode_utf8(ast->value);
                o << "'";
            } else if (ast->tokenKind == LiteralString::BLOCK) {
                o << "|||";
                if (ast->value.back() != U'\n') {
                    o << "-";
                }
                o << "\n";
                if (ast->value.c_str()[0] != U'\n')
                    o << ast->blockIndent;
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    // Formatter always outputs in unix mode.
                    if (*cp == '\r') continue;
                    std::string utf8;
                    encode_utf8(*cp, utf8);
                    o << utf8;
                    if (*cp == U'\n' && *(cp + 1) != U'\n' && *(cp + 1) != U'\0') {
                        o << ast->blockIndent;
                    }
                }
                if (ast->value.back() != U'\n') {
                    o << "\n";
                }
                o << ast->blockTermIndent << "|||";
            } else if (ast->tokenKind == LiteralString::VERBATIM_DOUBLE) {
                o << "@\"";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'"') {
                        o << "\"\"";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "\"";
            } else if (ast->tokenKind == LiteralString::VERBATIM_SINGLE) {
                o << "@'";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'\'') {
                        o << "''";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "'";
            }

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            o << "null";

        } else if (auto *ast = dynamic_cast<const Object *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->fields.size() > 0, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const DesugaredObject *>(ast_)) {
            o << "{";
            for (AST *assert : ast->asserts) {
                o << "assert";
                unparse(assert, true);
                o << ",";
            }
            for (auto &field : ast->fields) {
                o << "[";
                unparse(field.name, false);
                o << "]";
                switch (field.hide) {
                    case ObjectField::INHERIT: o << ":"; break;
                    case ObjectField::HIDDEN: o << "::"; break;
                    case ObjectField::VISIBLE: o << ":::"; break;
                }
                unparse(field.body, true);
                o << ",";
            }
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehension *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehensionSimple *>(ast_)) {
            o << "{[";
            unparse(ast->field, false);
            o << "]:";
            unparse(ast->value, true);
            o << " for " << unparse_id(ast->id) << " in";
            unparse(ast->array, true);
            o << "}";

        } else if (auto *ast = dynamic_cast<const Parens *>(ast_)) {
            o << "(";
            unparse(ast->expr, false);
            fill(ast->closeFodder, false, false);
            o << ")";

        } else if (dynamic_cast<const Self *>(ast_)) {
            o << "self";

        } else if (auto *ast = dynamic_cast<const SuperIndex *>(ast_)) {
            o << "super";
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                unparse(ast->index, false);
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Unary *>(ast_)) {
            o << uop_string(ast->op);
            unparse(ast->expr, false);

        } else if (auto *ast = dynamic_cast<const Var *>(ast_)) {
            o << encode_utf8(ast->id->name);

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }